

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O0

SharedDispatcher __thiscall
AmsConnection::DispatcherListAdd(AmsConnection *this,VirtualConnection *connection)

{
  bool bVar1;
  pointer ppVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<unsigned_short,_AmsAddr>,_std::shared_ptr<NotificationDispatcher>_>_>,_bool>
  pVar3;
  SharedDispatcher SVar4;
  AmsConnection *local_b0;
  code *local_a8;
  undefined8 local_a0;
  type local_98;
  undefined1 local_70 [16];
  _Rb_tree_iterator<std::pair<const_std::pair<unsigned_short,_AmsAddr>,_std::shared_ptr<NotificationDispatcher>_>_>
  local_60;
  undefined1 local_58;
  lock_guard<std::recursive_mutex> local_40;
  lock_guard<std::recursive_mutex> lock;
  undefined1 local_30 [8];
  SharedDispatcher dispatcher;
  VirtualConnection *connection_local;
  AmsConnection *this_local;
  
  dispatcher.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX;
  DispatcherListGet((AmsConnection *)local_30,connection);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    std::shared_ptr<NotificationDispatcher>::shared_ptr
              ((shared_ptr<NotificationDispatcher> *)this,
               (shared_ptr<NotificationDispatcher> *)local_30);
    lock._M_device._4_4_ = 1;
  }
  else {
    std::lock_guard<std::recursive_mutex>::lock_guard
              (&local_40,(mutex_type *)&connection[0x5b0].second.port);
    local_a8 = DeleteNotification;
    local_a0 = 0;
    local_b0 = (AmsConnection *)connection;
    std::
    bind<long(AmsConnection::*)(AmsAddr_const&,unsigned_int,unsigned_int,unsigned_short),AmsConnection*,AmsAddr_const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,unsigned_short_const&>
              (&local_98,(offset_in_AmsConnection_to_subr *)&local_a8,&local_b0,
               (AmsAddr *)
               ((long)&(dispatcher.
                        super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 2),
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
               (unsigned_short *)
               dispatcher.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    std::
    make_shared<NotificationDispatcher,std::_Bind<long(AmsConnection::*(AmsConnection*,AmsAddr,std::_Placeholder<1>,std::_Placeholder<2>,unsigned_short))(AmsAddr_const&,unsigned_int,unsigned_int,unsigned_short)>>
              ((_Bind<long_(AmsConnection::*(AmsConnection_*,_AmsAddr,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short))(const_AmsAddr_&,_unsigned_int,_unsigned_int,_unsigned_short)>
                *)local_70);
    pVar3 = std::
            map<std::pair<unsigned_short,AmsAddr>,std::shared_ptr<NotificationDispatcher>,std::less<std::pair<unsigned_short,AmsAddr>>,std::allocator<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>>
            ::
            emplace<std::pair<unsigned_short,AmsAddr>const&,std::shared_ptr<NotificationDispatcher>>
                      ((map<std::pair<unsigned_short,AmsAddr>,std::shared_ptr<NotificationDispatcher>,std::less<std::pair<unsigned_short,AmsAddr>>,std::allocator<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>>
                        *)(connection + 0x5ac),
                       (pair<unsigned_short,_AmsAddr> *)
                       dispatcher.
                       super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,(shared_ptr<NotificationDispatcher> *)local_70);
    local_60 = pVar3.first._M_node;
    local_58 = pVar3.second;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<unsigned_short,_AmsAddr>,_std::shared_ptr<NotificationDispatcher>_>_>
             ::operator->(&local_60);
    std::shared_ptr<NotificationDispatcher>::shared_ptr
              ((shared_ptr<NotificationDispatcher> *)this,&ppVar2->second);
    std::shared_ptr<NotificationDispatcher>::~shared_ptr
              ((shared_ptr<NotificationDispatcher> *)local_70);
    lock._M_device._4_4_ = 1;
    std::lock_guard<std::recursive_mutex>::~lock_guard(&local_40);
  }
  std::shared_ptr<NotificationDispatcher>::~shared_ptr
            ((shared_ptr<NotificationDispatcher> *)local_30);
  SVar4.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar4.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedDispatcher)
         SVar4.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedDispatcher AmsConnection::DispatcherListAdd(const VirtualConnection& connection)
{
    const auto dispatcher = DispatcherListGet(connection);
    if (dispatcher) {
        return dispatcher;
    }
    std::lock_guard<std::recursive_mutex> lock(dispatcherListMutex);
    return dispatcherList.emplace(connection,
                                  std::make_shared<NotificationDispatcher>(std::bind(&AmsConnection::DeleteNotification,
                                                                                     this,
                                                                                     connection.second,
                                                                                     std::placeholders::_1,
                                                                                     std::placeholders::_2,
                                                                                     connection.first))).first->second;
}